

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_componentNotEqualByMath_Test::TestBody(Equality_componentNotEqualByMath_Test *this)

{
  element_type *peVar1;
  byte bVar2;
  AssertHelper local_70 [8];
  Message local_68 [8];
  AssertionResult local_60 [2];
  AssertionResult gtest_ar_;
  ComponentPtr c1Alt;
  ComponentPtr c1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"child1",(allocator<char> *)&c1Alt);
  libcellml::Component::create((string *)&c1);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"child1",(allocator<char> *)&gtest_ar_);
  libcellml::Component::create((string *)&c1Alt);
  std::__cxx11::string::~string((string *)local_60);
  peVar1 = c1Alt.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"math",(allocator<char> *)&gtest_ar_);
  libcellml::Component::setMath((string *)peVar1);
  std::__cxx11::string::~string((string *)local_60);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_60,
             &c1Alt.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60[0].message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_60,&gtest_ar_.success_,"c1->equals(c1Alt)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x308,(char *)local_60[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_60,
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     c1Alt.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  gtest_ar_.success_ = (bool)(bVar2 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60[0].message_);
  if (bVar2 != 0) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_60,&gtest_ar_.success_,"c1Alt->equals(c1)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x309,(char *)local_60[0]._0_8_);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1Alt.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, componentNotEqualByMath)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("child1");
    libcellml::ComponentPtr c1Alt = libcellml::Component::create("child1");

    c1Alt->setMath("math");

    EXPECT_FALSE(c1->equals(c1Alt));
    EXPECT_FALSE(c1Alt->equals(c1));
}